

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O3

void wasm::printElement(ostream *os,Element *elem,int depth)

{
  char cVar1;
  _Head_base<1UL,_void_(*)(void_*),_false> _Var2;
  long lVar3;
  char *pcVar4;
  RandomElement<wasm::RandomLattice> *e;
  _Head_base<1UL,_void_(*)(void_*),_false> elem_00;
  int iVar5;
  Element *elem_01;
  
  elem_01 = (Element *)
            (elem->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
            super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
            _M_head_impl;
  if ((elem_01 != (Element *)0x0) &&
     (*(char *)&elem_01[2].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                super__Tuple_impl<1UL,_void_(*)(void_*)>.
                super__Head_base<1UL,_void_(*)(void_*),_false> == '\0')) {
    printFullElement(os,elem_01,depth);
    return;
  }
  iVar5 = depth;
  if (0 < depth) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    elem_01 = (Element *)
              (elem->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
              super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
              _M_head_impl;
  }
  if (elem_01 == (Element *)0x0) {
switchD_00197c81_default:
    wasm::handle_unreachable
              ("unexpected element",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
               ,499);
  }
  switch(*(undefined1 *)
          &((Element *)elem_01)[2].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
           super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>
           .super__Head_base<1UL,_void_(*)(void_*),_false>) {
  case 1:
    cVar1 = *(char *)((long)&(((Element *)elem_01)->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                             super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                             super__Tuple_impl<1UL,_void_(*)(void_*)>.
                             super__Head_base<1UL,_void_(*)(void_*),_false> + 4);
    if (cVar1 == '\x02') {
      pcVar4 = "flat top\n";
    }
    else {
      if (cVar1 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(os,"flat ",5);
        os = std::ostream::_M_insert<unsigned_long>((ulong)os);
        pcVar4 = "\n";
        lVar3 = 1;
        goto LAB_00197ea5;
      }
      pcVar4 = "flat bot\n";
    }
    goto LAB_00197e9d;
  case 2:
    if (*(char *)&((Element *)elem_01)[1].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                  super__Tuple_impl<1UL,_void_(*)(void_*)>.
                  super__Head_base<1UL,_void_(*)(void_*),_false> != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(os,"Lifted(\n",8);
      printElement(os,(Element *)elem_01,depth + 1);
      if (0 < depth) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
          depth = depth + -1;
        } while (depth != 0);
      }
      break;
    }
    pcVar4 = "lift bot\n";
LAB_00197e9d:
    lVar3 = 9;
    goto LAB_00197ea5;
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>(os,"Array[\n",7);
    printElement(os,(Element *)elem_01,depth + 1);
    printElement(os,(Element *)elem_01 + 1,depth + 1);
    if (0 < depth) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
        depth = depth + -1;
      } while (depth != 0);
    }
    break;
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>(os,"Vector[\n",8);
    elem_00._M_head_impl =
         (((Element *)elem_01)->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
         super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
         super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl;
    _Var2._M_head_impl =
         (_func_void_void_ptr *)
         (((Element *)elem_01)->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
         super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
         _M_head_impl;
    if (elem_00._M_head_impl != _Var2._M_head_impl) {
      do {
        printElement(os,(Element *)elem_00._M_head_impl,depth + 1);
        elem_00._M_head_impl = elem_00._M_head_impl + 0x10;
      } while (elem_00._M_head_impl != _Var2._M_head_impl);
    }
    if (0 < depth) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
        depth = depth + -1;
      } while (depth != 0);
    }
    pcVar4 = "]\n";
    goto LAB_00197e86;
  case 5:
    std::__ostream_insert<char,std::char_traits<char>>(os,"Tuple(\n",7);
    printElement(os,(Element *)elem_01 + 1,depth + 1);
    printElement(os,(Element *)elem_01,depth + 1);
    if (0 < depth) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
        depth = depth + -1;
      } while (depth != 0);
    }
    break;
  case 6:
    std::__ostream_insert<char,std::char_traits<char>>(os,"SharedPath(\n",0xc);
    printElement(os,(Element *)
                    (((Element *)elem_01)->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                    super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                    super__Tuple_impl<1UL,_void_(*)(void_*)>.
                    super__Head_base<1UL,_void_(*)(void_*),_false>,depth + 1);
    if (0 < depth) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
        depth = depth + -1;
      } while (depth != 0);
    }
    break;
  default:
    goto switchD_00197c81_default;
  }
  pcVar4 = ")\n";
LAB_00197e86:
  lVar3 = 2;
LAB_00197ea5:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,lVar3);
  return;
}

Assistant:

void printElement(std::ostream& os,
                  const typename RandomLattice::Element& elem,
                  int depth = 0) {
  if (const auto* e =
        std::get_if<typename RandomFullLattice::Element>(&*elem)) {
    printFullElement(os, *e, depth);
    return;
  }

  indent(os, depth);

  if (const auto* e = std::get_if<typename Flat<uint32_t>::Element>(&*elem)) {
    if (e->isBottom()) {
      os << "flat bot\n";
    } else if (e->isTop()) {
      os << "flat top\n";
    } else {
      os << "flat " << *e->getVal() << "\n";
    }
  } else if (const auto* e =
               std::get_if<typename Lift<RandomLattice>::Element>(&*elem)) {
    if (e->isBottom()) {
      os << "lift bot\n";
    } else {
      os << "Lifted(\n";
      printElement(os, **e, depth + 1);
      indent(os, depth);
      os << ")\n";
    }
  } else if (const auto* e =
               std::get_if<typename ArrayLattice::Element>(&*elem)) {
    os << "Array[\n";
    printElement(os, e->front(), depth + 1);
    printElement(os, e->back(), depth + 1);
    indent(os, depth);
    os << ")\n";
  } else if (const auto* vec =
               std::get_if<typename Vector<RandomLattice>::Element>(&*elem)) {
    os << "Vector[\n";
    for (const auto& e : *vec) {
      printElement(os, e, depth + 1);
    }
    indent(os, depth);
    os << "]\n";
  } else if (const auto* e =
               std::get_if<typename TupleLattice::Element>(&*elem)) {
    os << "Tuple(\n";
    const auto& [first, second] = *e;
    printElement(os, first, depth + 1);
    printElement(os, second, depth + 1);
    indent(os, depth);
    os << ")\n";
  } else if (const auto* e =
               std::get_if<typename SharedPath<RandomLattice>::Element>(
                 &*elem)) {
    os << "SharedPath(\n";
    printElement(os, **e, depth + 1);
    indent(os, depth);
    os << ")\n";
  } else {
    WASM_UNREACHABLE("unexpected element");
  }
}